

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_cmd_ln.c
# Opt level: O3

int validate_readable_dir(char *switch_name,void *arg)

{
  int iVar1;
  char *fmt;
  long ln;
  stat s;
  stat sStack_a8;
  
  if (arg == (void *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
            ,0x9a,"%s is a necessary switch\n",switch_name);
  }
  else {
    iVar1 = stat((char *)arg,&sStack_a8);
    if (iVar1 < 0) {
      fmt = "%s %s does not exist or is inaccessible\n";
      ln = 0xa0;
    }
    else {
      if ((sStack_a8.st_mode & 0xf000) == 0x4000) {
        return 1;
      }
      fmt = "%s %s is not a directory\n";
      ln = 0xa6;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
            ,ln,fmt,switch_name,arg);
  }
  return 0;
}

Assistant:

int
validate_readable_dir(char *switch_name, void *arg)
{
#ifndef _WIN32
    char *path = arg;
    struct stat s;

    if (path == NULL) {
	E_ERROR("%s is a necessary switch\n", switch_name);

	return FALSE;
    }

    if (stat(path, &s) < 0) {
	E_ERROR("%s %s does not exist or is inaccessible\n", switch_name, path);

	return FALSE;
    }

    if (!S_ISDIR(s.st_mode)) {
	E_ERROR("%s %s is not a directory\n", switch_name, path);

	return FALSE;
    }	

    if ((s.st_mode && S_IROTH) ||
	((s.st_uid == getuid()) && (s.st_mode && S_IRUSR)) ||
	((s.st_gid == getgid()) && (s.st_mode && S_IRGRP))) {
	return TRUE;
    }
    else {
	E_ERROR("%s %s is not readable\n", switch_name, path);

	return FALSE;
    }
#else
    /* _WIN32 */

    /* Do no validation for now.  Need to figure out a _WIN32 compatible
       way */

    return TRUE;
#endif
}